

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader.c
# Opt level: O0

int loader_metadata_cb_iterate(plugin_manager manager,plugin p,void *data)

{
  value pvVar1;
  long *in_RDX;
  loader_impl in_RSI;
  plugin in_RDI;
  loader_metadata_cb_iterator metadata_iterator;
  loader_impl impl;
  
  plugin_impl(in_RSI);
  pvVar1 = loader_metadata_impl(in_RDI,in_RSI);
  *(value *)(in_RDX[1] + *in_RDX * 8) = pvVar1;
  if (*(long *)(in_RDX[1] + *in_RDX * 8) != 0) {
    *in_RDX = *in_RDX + 1;
  }
  return 0;
}

Assistant:

int loader_metadata_cb_iterate(plugin_manager manager, plugin p, void *data)
{
	loader_impl impl = plugin_impl_type(p, loader_impl);
	loader_metadata_cb_iterator metadata_iterator = data;

	(void)manager;

	metadata_iterator->values[metadata_iterator->iterator] = loader_metadata_impl(p, impl);

	if (metadata_iterator->values[metadata_iterator->iterator] != NULL)
	{
		++metadata_iterator->iterator;
	}

	return 0;
}